

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Interaction * __thiscall pbrt::Transform::operator()(Transform *this,Interaction *in)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  Normal3<float> n;
  Vector3<float> v;
  Vector3<float> v_00;
  long in_RDX;
  Interaction *in_RSI;
  Interaction *in_RDI;
  type tVar4;
  float fVar5;
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  Normal3<float> NVar12;
  Vector3<float> VVar13;
  Interaction *ret;
  Point3fi *in_stack_00000378;
  Transform *in_stack_00000380;
  undefined4 local_168;
  float fVar14;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 uVar15;
  float in_stack_fffffffffffffee0;
  undefined4 uVar16;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined1 auVar6 [64];
  undefined1 auVar8 [64];
  float fVar11;
  
  local_168 = SUB84(in_RDI,0);
  fVar14 = (float)((ulong)in_RDI >> 0x20);
  Interaction::Interaction(in_RSI);
  operator()(in_stack_00000380,in_stack_00000378);
  puVar2 = (undefined8 *)CONCAT44(fVar14,local_168);
  puVar2[2] = local_20;
  *puVar2 = local_30;
  puVar2[1] = uStack_28;
  auVar10 = ZEXT856(0);
  NVar12 = operator()((Transform *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      *(Tuple3<pbrt::Normal3,_float> *)(in_RDX + 0x28));
  fVar11 = NVar12.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar6._0_8_ = NVar12.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  lVar3 = CONCAT44(fVar14,local_168);
  uVar15 = vmovlpd_avx(auVar6._0_16_);
  *(float *)(lVar3 + 0x30) = fVar11;
  *(undefined8 *)(lVar3 + 0x28) = uVar15;
  uVar16 = *(undefined4 *)(lVar3 + 0x30);
  NVar12.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffffea0;
  NVar12.super_Tuple3<pbrt::Normal3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  NVar12.super_Tuple3<pbrt::Normal3,_float>.x = fVar14;
  tVar4 = LengthSquared<float>(NVar12);
  if (0.0 < tVar4) {
    auVar10 = ZEXT856(0);
    n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffee0;
    n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffffed8;
    n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    NVar12 = Normalize<float>(n);
    auVar7._0_8_ = NVar12.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar7._8_56_ = auVar10;
    uVar1 = vmovlpd_avx(auVar7._0_16_);
    *(undefined8 *)(CONCAT44(fVar14,local_168) + 0x28) = uVar1;
    *(float *)(CONCAT44(fVar14,local_168) + 0x30) = NVar12.super_Tuple3<pbrt::Normal3,_float>.z;
  }
  *(undefined8 *)(CONCAT44(fVar14,local_168) + 0x34) = *(undefined8 *)(in_RDX + 0x34);
  auVar10 = ZEXT856(0);
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
  v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
  v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
  VVar13 = operator()((Transform *)CONCAT44(in_stack_ffffffffffffff7c,uVar16),v_00);
  auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar10;
  lVar3 = CONCAT44(fVar14,local_168);
  uVar15 = vmovlpd_avx(auVar8._0_16_);
  *(float *)(lVar3 + 0x24) = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  *(undefined8 *)(lVar3 + 0x1c) = uVar15;
  fVar11 = *(float *)(lVar3 + 0x24);
  uVar15 = *(undefined8 *)(lVar3 + 0x1c);
  VVar13.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffea0;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  VVar13.super_Tuple3<pbrt::Vector3,_float>.x = fVar14;
  fVar5 = LengthSquared<float>(VVar13);
  if (0.0 < fVar5) {
    auVar10 = ZEXT856(0);
    v.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
    v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
    v.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar15 >> 0x20);
    VVar13 = Normalize<float>(v);
    auVar9._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar10;
    uVar15 = vmovlpd_avx(auVar9._0_16_);
    *(undefined8 *)(CONCAT44(fVar14,local_168) + 0x1c) = uVar15;
    *(float *)(CONCAT44(fVar14,local_168) + 0x24) = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  *(undefined4 *)(CONCAT44(fVar14,local_168) + 0x18) = *(undefined4 *)(in_RDX + 0x18);
  *(undefined8 *)(CONCAT44(fVar14,local_168) + 0x40) = *(undefined8 *)(in_RDX + 0x40);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU Interaction Transform::operator()(const Interaction &in) const {
    Interaction ret;
    ret.pi = (*this)(in.pi);
    ret.n = (*this)(in.n);
    if (LengthSquared(ret.n) > 0)
        ret.n = Normalize(ret.n);
    ret.uv = in.uv;
    ret.wo = (*this)(in.wo);
    if (LengthSquared(ret.wo) > 0)
        ret.wo = Normalize(ret.wo);
    ret.time = in.time;
    ret.mediumInterface = in.mediumInterface;
    return ret;
}